

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start_Resume_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Start_Resume_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Start_Resume_PDU *this)

{
  ostream *poVar1;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Start_Resume_PDU *local_18;
  Start_Resume_PDU *this_local;
  
  local_18 = this;
  this_local = (Start_Resume_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Start/Resume PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1f0,&this->super_Simulation_Management_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"Real World Time:\n");
  DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(&local_230,&this->m_RealWorldTime);
  UTILS::IndentString(&local_210,&local_230,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"Simulation Time:\n");
  DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(&local_270,&this->m_SimTime);
  UTILS::IndentString(&local_250,&local_270,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"Request ID: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32RequestID);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Start_Resume_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Start/Resume PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "Real World Time:\n"
       << IndentString( m_RealWorldTime.GetAsString(), 1 )
       << "Simulation Time:\n"
       << IndentString( m_SimTime.GetAsString(), 1 )
       << "Request ID: " << m_ui32RequestID
       << "\n";

    return ss.str();
}